

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int DLevelScript::DoSpawn(int type,DVector3 *pos,int tid,DAngle *angle,bool force)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char *name;
  PClassActor *pPVar4;
  AActor *mobj;
  int iVar5;
  
  name = FBehavior::StaticLookupString(type);
  pPVar4 = PClass::FindActor(name);
  iVar5 = 0;
  if ((pPVar4 != (PClassActor *)0x0) &&
     ((pPVar4 = PClassActor::GetReplacement(pPVar4,true),
      ((pPVar4->super_PClass).Defaults[0x195] & 0x20) == 0 ||
      (iVar5 = 0, (level.flags2 & 0x8000) == 0 && (dmflags.Value & 0x1000U) == 0)))) {
    iVar5 = 0;
    mobj = AActor::StaticSpawn(pPVar4,pos,ALLOW_REPLACE,false);
    if (mobj != (AActor *)0x0) {
      uVar1 = (mobj->flags2).Value;
      (mobj->flags2).Value = uVar1 | 0x1000;
      if ((!force) && (bVar3 = P_TestMobjLocation(mobj), !bVar3)) {
        AActor::ClearCounters(mobj);
        (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
        return 0;
      }
      (mobj->Angles).Yaw.Degrees = angle->Degrees;
      mobj->tid = tid;
      AActor::AddToHash(mobj);
      uVar2 = (mobj->flags).Value;
      if ((uVar2 & 1) != 0) {
        (mobj->flags).Value = uVar2 | 0x20000;
      }
      (mobj->flags2).Value = uVar1;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int DLevelScript::DoSpawn (int type, const DVector3 &pos, int tid, DAngle angle, bool force)
{
	PClassActor *info = PClass::FindActor(FBehavior::StaticLookupString (type));
	AActor *actor = NULL;
	int spawncount = 0;

	if (info != NULL)
	{
		info = info->GetReplacement ();

		if ((GetDefaultByType (info)->flags3 & MF3_ISMONSTER) &&
			((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		{
			return 0;
		}

		actor = Spawn (info, pos, ALLOW_REPLACE);
		if (actor != NULL)
		{
			ActorFlags2 oldFlags2 = actor->flags2;
			actor->flags2 |= MF2_PASSMOBJ;
			if (force || P_TestMobjLocation (actor))
			{
				actor->Angles.Yaw = angle;
				actor->tid = tid;
				actor->AddToHash ();
				if (actor->flags & MF_SPECIAL)
					actor->flags |= MF_DROPPED;  // Don't respawn
				actor->flags2 = oldFlags2;
				spawncount++;
			}
			else
			{
				// If this is a monster, subtract it from the total monster
				// count, because it already added to it during spawning.
				actor->ClearCounters();
				actor->Destroy ();
				actor = NULL;
			}
		}
	}
	return spawncount;
}